

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O2

HTTPAPIEX_RESULT
HTTPAPIEX_ExecuteRequest
          (HTTPAPIEX_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE requestHttpHeadersHandle,BUFFER_HANDLE requestContent,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHttpHeadersHandle,BUFFER_HANDLE responseContent)

{
  BUFFER_HANDLE handle_00;
  int iVar1;
  HTTP_HEADERS_RESULT HVar2;
  HTTPAPI_RESULT HVar3;
  LOGGER_LOG p_Var4;
  HTTP_HEADERS_HANDLE pHVar5;
  size_t sVar6;
  ulong uVar7;
  HTTP_HANDLE pHVar8;
  undefined8 *puVar9;
  uchar *content;
  long lVar10;
  HTTPAPIEX_RESULT HVar11;
  char *pcVar12;
  size_t index;
  undefined8 uVar13;
  _Bool isOriginalRequestContent;
  _Bool st [3];
  _Bool isOriginalResponseContent;
  HTTP_HEADERS_HANDLE local_88;
  BUFFER_HANDLE local_80;
  HTTP_HEADERS_HANDLE local_78;
  BUFFER_HANDLE local_70;
  HTTP_HEADERS_HANDLE local_68;
  char *local_60;
  uint *local_58;
  BUFFER_HANDLE local_50;
  BUFFER_HANDLE local_48;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar1 = 0x175;
  }
  else {
    if (requestType - HTTPAPI_REQUEST_GET < 6) {
      local_88 = requestHttpHeadersHandle;
      iVar1 = buildBufferIfNotExist(requestContent,&isOriginalRequestContent,&local_50);
      if (iVar1 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar12 = "unable to build the request content";
          iVar1 = 0xfd;
          goto LAB_00106df2;
        }
        goto LAB_00106df7;
      }
      local_80 = local_50;
      pHVar5 = local_88;
      if ((local_88 == (HTTP_HEADERS_HANDLE)0x0) &&
         (pHVar5 = HTTPHeaders_Alloc(), pHVar5 == (HTTP_HEADERS_HANDLE)0x0)) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                    ,"buildRequestHttpHeadersHandle",0x96,1,"unable to HTTPHeaders_Alloc");
        }
LAB_00106db4:
        if (isOriginalRequestContent == false) {
          BUFFER_delete(local_80);
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar12 = "unable to build the request http headers handle";
          iVar1 = 0x109;
LAB_00106df2:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                    ,"buildAllRequests",iVar1,1,pcVar12);
        }
      }
      else {
        local_48 = (BUFFER_HANDLE)0x0;
        uStack_40 = 0;
        uStack_3a = 0;
        uStack_38 = 0;
        sVar6 = BUFFER_length(local_80);
        size_tToString((char *)&local_48,0x16,sVar6);
        pcVar12 = STRING_c_str(handle->hostName);
        local_78 = pHVar5;
        HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair(pHVar5,"Host",pcVar12);
        if ((HVar2 != HTTP_HEADERS_OK) ||
           (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair
                              (local_78,"Content-Length",(char *)&local_48),
           HVar2 != HTTP_HEADERS_OK)) {
          if (local_88 == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(local_78);
          }
          goto LAB_00106db4;
        }
        pcVar12 = "";
        if (relativePath != (char *)0x0) {
          pcVar12 = relativePath;
        }
        local_58 = &dummyStatusCode;
        if (statusCode != (uint *)0x0) {
          local_58 = statusCode;
        }
        pHVar5 = responseHttpHeadersHandle;
        if ((responseHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) ||
           (pHVar5 = HTTPHeaders_Alloc(), pHVar5 != (HTTP_HEADERS_HANDLE)0x0)) {
          iVar1 = buildBufferIfNotExist(responseContent,&isOriginalResponseContent,&local_48);
          if (iVar1 == 0) {
            local_60 = pcVar12;
            local_68 = pHVar5;
            st[0] = false;
            st[1] = false;
            st[2] = false;
            uVar7 = (ulong)(uint)handle->k;
            if (handle->k == 0xffffffff) {
              handle->k = 0;
              uVar7 = 0;
            }
            HVar11 = HTTPAPIEX_OK;
            local_70 = local_48;
            do {
              handle_00 = local_80;
              iVar1 = (int)uVar7;
              if (2 < iVar1) break;
              if (st[iVar1] == false) {
                if (iVar1 == 2) {
                  sVar6 = BUFFER_length(local_80);
                  content = BUFFER_u_char(handle_00);
                  HVar3 = HTTPAPI_ExecuteRequest
                                    (handle->httpHandle,requestType,local_60,local_78,content,sVar6,
                                     local_58,local_68,local_70);
LAB_00106ff5:
                  if (HVar3 == HTTPAPI_OK) goto LAB_00106ffe;
                  goto LAB_00106e9f;
                }
                if (iVar1 == 1) {
                  pcVar12 = STRING_c_str(handle->hostName);
                  pHVar8 = HTTPAPI_CreateConnection(pcVar12);
                  handle->httpHandle = pHVar8;
                  if (pHVar8 != (HTTP_HANDLE)0x0) {
                    sVar6 = VECTOR_size(handle->savedOptions);
                    for (index = 0; sVar6 != index; index = index + 1) {
                      puVar9 = (undefined8 *)VECTOR_element(handle->savedOptions,index);
                      HVar3 = HTTPAPI_SetOption(handle->httpHandle,(char *)*puVar9,(void *)puVar9[1]
                                               );
                      if ((HVar3 != HTTPAPI_OK) &&
                         (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                                  ,"HTTPAPIEX_ExecuteRequest",0x1d8,1,
                                  "HTTPAPI_SetOption failed when called for option %s",*puVar9);
                      }
                    }
                    goto LAB_00106ffe;
                  }
                  goto LAB_00106e9f;
                }
                if (iVar1 != 0) goto LAB_00106e9f;
                if (useGlobalInitialization < 1) {
                  HVar3 = HTTPAPI_Init();
                  goto LAB_00106ff5;
                }
LAB_00106ffe:
                lVar10 = (long)handle->k;
                if (lVar10 == 2) goto LAB_00107057;
                st[lVar10] = true;
                uVar7 = lVar10 + 1;
                handle->k = (int)uVar7;
                st[lVar10 + 1] = false;
              }
              else {
LAB_00106e9f:
                iVar1 = handle->k;
                uVar7 = (ulong)(iVar1 - 1U);
                st[iVar1] = false;
                handle->k = iVar1 - 1U;
                if ((long)iVar1 == 2) {
                  HTTPAPI_CloseConnection(handle->httpHandle);
                  handle->httpHandle = (HTTP_HANDLE)0x0;
                }
                else {
                  if ((iVar1 != 1) || (uVar7 = 0, useGlobalInitialization != 0)) goto LAB_0010701a;
                  HTTPAPI_Deinit();
                }
                uVar7 = (ulong)(uint)handle->k;
              }
LAB_0010701a:
            } while (-1 < (int)uVar7);
            p_Var4 = xlogging_get_log_function();
            HVar11 = HTTPAPIEX_RECOVERYFAILED;
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                        ,"HTTPAPIEX_ExecuteRequest",0x227,1,
                        "unable to recover sending to a working state");
            }
LAB_00107057:
            if (isOriginalRequestContent == false) {
              BUFFER_delete(local_80);
            }
            if (local_88 == (HTTP_HEADERS_HANDLE)0x0) {
              HTTPHeaders_Free(local_78);
            }
            if (isOriginalResponseContent == false) {
              BUFFER_delete(local_70);
            }
            if (responseHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) {
              return HVar11;
            }
            HTTPHeaders_Free(local_68);
            return HVar11;
          }
          if (isOriginalRequestContent == false) {
            BUFFER_delete(local_80);
          }
          if (local_88 == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(local_78);
          }
          if (responseHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(pHVar5);
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106df7;
          pcVar12 = "unable to build response content";
          iVar1 = 0x14a;
          goto LAB_00106df2;
        }
        if (isOriginalRequestContent == false) {
          BUFFER_delete(local_80);
        }
        if (local_88 == (HTTP_HEADERS_HANDLE)0x0) {
          HTTPHeaders_Free(local_78);
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar12 = "unable to build response content";
          iVar1 = 0x131;
          goto LAB_00106df2;
        }
      }
LAB_00106df7:
      p_Var4 = xlogging_get_log_function();
      HVar11 = HTTPAPIEX_ERROR;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return HTTPAPIEX_ERROR;
      }
      iVar1 = 0x194;
      uVar13 = 2;
      pcVar12 = HTTPAPIEX_RESULTStringStorage[2];
      goto LAB_00106e41;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar1 = 0x17d;
  }
  HVar11 = HTTPAPIEX_INVALID_ARG;
  uVar13 = 3;
  pcVar12 = HTTPAPIEX_RESULTStringStorage[3];
LAB_00106e41:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
            ,"HTTPAPIEX_ExecuteRequest",iVar1,1,"error code = %s%s (%d)","",pcVar12,uVar13);
  return HVar11;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_ExecuteRequest(HTTPAPIEX_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
    HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode,
    HTTP_HEADERS_HANDLE responseHttpHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_006: [If parameter handle is NULL then HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.]*/
    if (handle == NULL)
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_007: [If parameter requestType does not indicate a valid request, HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.] */
        if (!validRequestType(requestType))
        {
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA *handleData = (HTTPAPIEX_HANDLE_DATA *)handle;

            /*call to buildAll*/
            const char* toBeUsedRelativePath;
            HTTP_HEADERS_HANDLE toBeUsedRequestHttpHeadersHandle; bool isOriginalRequestHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedRequestContent; bool isOriginalRequestContent;
            unsigned int* toBeUsedStatusCode;
            HTTP_HEADERS_HANDLE toBeUsedResponseHttpHeadersHandle; bool isOriginalResponseHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedResponseContent;  bool isOriginalResponseContent;

            if (buildAllRequests(handleData, requestType, relativePath, requestHttpHeadersHandle, requestContent, statusCode, responseHttpHeadersHandle, responseContent,
                &toBeUsedRelativePath,
                &toBeUsedRequestHttpHeadersHandle, &isOriginalRequestHttpHeadersHandle,
                &toBeUsedRequestContent, &isOriginalRequestContent,
                &toBeUsedStatusCode,
                &toBeUsedResponseHttpHeadersHandle, &isOriginalResponseHttpHeadersHandle,
                &toBeUsedResponseContent, &isOriginalResponseContent) != 0)
            {
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();
            }
            else
            {

                /*Codes_SRS_HTTPAPIEX_02_023: [HTTPAPIEX_ExecuteRequest shall try to execute the HTTP call by ensuring the following API call sequence is respected:]*/
                /*Codes_SRS_HTTPAPIEX_02_024: [If any point in the sequence fails, HTTPAPIEX_ExecuteRequest shall attempt to recover by going back to the previous step and retrying that step.]*/
                /*Codes_SRS_HTTPAPIEX_02_025: [If the first step fails, then the sequence fails.]*/
                /*Codes_SRS_HTTPAPIEX_02_026: [A step shall be retried at most once.]*/
                /*Codes_SRS_HTTPAPIEX_02_027: [If a step has been retried then all subsequent steps shall be retried too.]*/
                bool st[3] = { false, false, false }; /*the three levels of possible failure in resilient send: HTTAPI_Init, HTTPAPI_CreateConnection, HTTPAPI_ExecuteRequest*/
                if (handleData->k == -1)
                {
                    handleData->k = 0;
                }

                do
                {
                    bool goOn;

                    if (handleData->k > 2)
                    {
                        /* error */
                        break;
                    }

                    if (st[handleData->k] == true) /*already been tried*/
                    {
                        goOn = false;
                    }
                    else
                    {
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            if (useGlobalInitialization > 0)
                            {
                                /*Codes_SRS_HTTPAPIEX_21_048: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Init.] */
                                goOn = true;
                            }
                            else if (HTTPAPI_Init() != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        case 1:
                        {
                            if ((handleData->httpHandle = HTTPAPI_CreateConnection(STRING_c_str(handleData->hostName))) == NULL)
                            {
                                goOn = false;
                            }
                            else
                            {
                                size_t i;
                                size_t vectorSize = VECTOR_size(handleData->savedOptions);
                                for (i = 0; i < vectorSize; i++)
                                {
                                    /*Codes_SRS_HTTPAPIEX_02_035: [HTTPAPIEX_ExecuteRequest shall pass all the saved options (see HTTPAPIEX_SetOption) to the newly create HTTPAPI_HANDLE in step 2 by calling HTTPAPI_SetOption.]*/
                                    /*Codes_SRS_HTTPAPIEX_02_036: [If setting the option fails, then the failure shall be ignored.] */
                                    HTTPAPIEX_SAVED_OPTION* option = (HTTPAPIEX_SAVED_OPTION*)VECTOR_element(handleData->savedOptions, i);
                                    if (HTTPAPI_SetOption(handleData->httpHandle, option->optionName, option->value) != HTTPAPI_OK)
                                    {
                                        LogError("HTTPAPI_SetOption failed when called for option %s", option->optionName);
                                    }
                                }
                                goOn = true;
                            }
                            break;
                        }
                        case 2:
                        {
                            size_t length = BUFFER_length(toBeUsedRequestContent);
                            unsigned char* buffer = BUFFER_u_char(toBeUsedRequestContent);
                            if (HTTPAPI_ExecuteRequest(handleData->httpHandle, requestType, toBeUsedRelativePath, toBeUsedRequestHttpHeadersHandle, buffer, length, toBeUsedStatusCode, toBeUsedResponseHttpHeadersHandle, toBeUsedResponseContent) != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        default:
                        {
                            /*serious error*/
                            goOn = false;
                            break;
                        }
                        }
                    }

                    if (goOn)
                    {
                        if (handleData->k == 2)
                        {
                            /*Codes_SRS_HTTPAPIEX_02_028: [HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_OK when a call to HTTPAPI_ExecuteRequest has been completed successfully.]*/
                            result = HTTPAPIEX_OK;
                            goto out;
                        }
                        else
                        {
                            st[handleData->k] = true;
                            handleData->k++;
                            st[handleData->k] = false;
                        }
                    }
                    else
                    {
                        st[handleData->k] = false;
                        handleData->k--;
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            /*Codes_SRS_HTTPAPIEX_21_049: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Deinit.] */
                            if (useGlobalInitialization == 0)
                            {
                                HTTPAPI_Deinit();
                            }
                            break;
                        }
                        case 1:
                        {
                            HTTPAPI_CloseConnection(handleData->httpHandle);
                            handleData->httpHandle = NULL;
                            break;
                        }
                        case 2:
                        {
                            break;
                        }
                        default:
                        {
                            break;
                        }
                        }
                    }
                } while (handleData->k >= 0);
                /*Codes_SRS_HTTPAPIEX_02_029: [Otherwise, HTTAPIEX_ExecuteRequest shall return HTTPAPIEX_RECOVERYFAILED.] */
                result = HTTPAPIEX_RECOVERYFAILED;
                LogError("unable to recover sending to a working state");
            out:;
                /*in all cases, unbuild the temporaries*/
                if (isOriginalRequestContent == false)
                {
                    BUFFER_delete(toBeUsedRequestContent);
                    toBeUsedRequestContent = NULL;
                }
                if (isOriginalRequestHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedRequestHttpHeadersHandle);
                    toBeUsedRequestHttpHeadersHandle = NULL;
                }
                if (isOriginalResponseContent == false)
                {
                    BUFFER_delete(toBeUsedResponseContent);
                    toBeUsedResponseContent = NULL;
                }
                if (isOriginalResponseHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedResponseHttpHeadersHandle);
                    toBeUsedResponseHttpHeadersHandle = NULL;
                }
            }
        }
    }
    return result;
}